

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  uint _w;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  int *piVar5;
  void *pvVar6;
  float *pfVar7;
  uint _w_00;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Mat local_78;
  
  _w = bottom_top_blob->c;
  uVar13 = (ulong)_w;
  _w_00 = bottom_top_blob->h * bottom_top_blob->w;
  sVar2 = bottom_top_blob->elemsize;
  iVar8 = this->across_spatial;
  iVar1 = this->across_channel;
  if (iVar1 == 0 || iVar8 == 0) {
    if (iVar8 == 0 || iVar1 != 0) {
      if (iVar1 != 0 && iVar8 == 0) {
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78._20_8_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,_w_00,sVar2,opt->workspace_allocator);
        iVar8 = -100;
        if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
          if (this->channel_shared == 0) {
            if (0 < (int)_w_00) {
              pfVar7 = (float *)bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              iVar8 = this->eps_mode;
              uVar10 = 0;
              do {
                fVar14 = 0.0;
                uVar11 = uVar13;
                pfVar12 = pfVar7;
                if (0 < (int)_w) {
                  do {
                    fVar14 = fVar14 + *pfVar12 * *pfVar12;
                    uVar11 = uVar11 - 1;
                    pfVar12 = (float *)((long)pfVar12 + sVar2 * sVar3);
                  } while (uVar11 != 0);
                }
                if (iVar8 == 0) {
                  fVar14 = fVar14 + this->eps;
LAB_00445400:
                  fVar15 = SQRT(fVar14);
                }
                else {
                  if (iVar8 != 1) {
                    if (fVar14 <= this->eps) {
                      fVar14 = this->eps;
                    }
                    goto LAB_00445400;
                  }
                  fVar15 = SQRT(fVar14);
                  if (SQRT(fVar14) <= this->eps) {
                    fVar15 = this->eps;
                  }
                }
                *(float *)((long)local_78.data + uVar10 * 4) = 1.0 / fVar15;
                uVar10 = uVar10 + 1;
                pfVar7 = pfVar7 + 1;
              } while (uVar10 != _w_00);
            }
            if (0 < (int)_w) {
              pvVar6 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              pvVar4 = (this->scale_data).data;
              uVar10 = 0;
              do {
                if (0 < (int)_w_00) {
                  fVar14 = *(float *)((long)pvVar4 + uVar10 * 4);
                  uVar11 = 0;
                  do {
                    *(float *)((long)pvVar6 + uVar11 * 4) =
                         *(float *)((long)pvVar6 + uVar11 * 4) * fVar14 *
                         *(float *)((long)local_78.data + uVar11 * 4);
                    uVar11 = uVar11 + 1;
                  } while (_w_00 != uVar11);
                }
                uVar10 = uVar10 + 1;
                pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
              } while (uVar10 != uVar13);
            }
          }
          else {
            if (0 < (int)_w_00) {
              fVar14 = *(this->scale_data).data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              pfVar7 = (float *)bottom_top_blob->data;
              iVar8 = this->eps_mode;
              uVar10 = 0;
              do {
                fVar15 = 0.0;
                uVar11 = uVar13;
                pfVar12 = pfVar7;
                if (0 < (int)_w) {
                  do {
                    fVar15 = fVar15 + *pfVar12 * *pfVar12;
                    uVar11 = uVar11 - 1;
                    pfVar12 = (float *)((long)pfVar12 + sVar2 * sVar3);
                  } while (uVar11 != 0);
                }
                if (iVar8 == 0) {
                  fVar15 = fVar15 + this->eps;
LAB_004451ee:
                  fVar16 = SQRT(fVar15);
                }
                else {
                  if (iVar8 != 1) {
                    if (fVar15 <= this->eps) {
                      fVar15 = this->eps;
                    }
                    goto LAB_004451ee;
                  }
                  fVar16 = SQRT(fVar15);
                  if (SQRT(fVar15) <= this->eps) {
                    fVar16 = this->eps;
                  }
                }
                *(float *)((long)local_78.data + uVar10 * 4) = fVar14 / fVar16;
                uVar10 = uVar10 + 1;
                pfVar7 = pfVar7 + 1;
              } while (uVar10 != _w_00);
            }
            if (0 < (int)_w) {
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              pvVar6 = bottom_top_blob->data;
              uVar10 = 0;
              do {
                if (0 < (int)_w_00) {
                  uVar11 = 0;
                  do {
                    *(float *)((long)pvVar6 + uVar11 * 4) =
                         *(float *)((long)local_78.data + uVar11 * 4) *
                         *(float *)((long)pvVar6 + uVar11 * 4);
                    uVar11 = uVar11 + 1;
                  } while (_w_00 != uVar11);
                }
                uVar10 = uVar10 + 1;
                pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
              } while (uVar10 != uVar13);
            }
          }
          iVar8 = 0;
        }
        piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar5 == (int *)0x0) {
          return iVar8;
        }
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) {
          return iVar8;
        }
        if (local_78.allocator != (Allocator *)0x0) {
          (*(local_78.allocator)->_vptr_Allocator[3])();
          return iVar8;
        }
        goto LAB_0044549e;
      }
    }
    else if (0 < (int)_w) {
      pvVar6 = bottom_top_blob->data;
      iVar8 = this->channel_shared;
      iVar1 = this->eps_mode;
      sVar3 = bottom_top_blob->cstep;
      uVar10 = 0;
      do {
        fVar14 = 0.0;
        if (0 < (int)_w_00) {
          uVar11 = 0;
          do {
            fVar15 = *(float *)((long)pvVar6 + uVar11 * 4);
            fVar14 = fVar14 + fVar15 * fVar15;
            uVar11 = uVar11 + 1;
          } while (_w_00 != uVar11);
        }
        if (iVar1 == 0) {
          fVar14 = fVar14 + this->eps;
LAB_00444feb:
          fVar15 = SQRT(fVar14);
        }
        else {
          if (iVar1 != 1) {
            if (fVar14 <= this->eps) {
              fVar14 = this->eps;
            }
            goto LAB_00444feb;
          }
          fVar15 = SQRT(fVar14);
          if (SQRT(fVar14) <= this->eps) {
            fVar15 = this->eps;
          }
        }
        if (0 < (int)_w_00) {
          uVar11 = uVar10 & 0xffffffff;
          if (iVar8 != 0) {
            uVar11 = 0;
          }
          fVar14 = *(float *)((long)(this->scale_data).data + uVar11 * 4);
          uVar11 = 0;
          do {
            *(float *)((long)pvVar6 + uVar11 * 4) =
                 *(float *)((long)pvVar6 + uVar11 * 4) * fVar14 * (1.0 / fVar15);
            uVar11 = uVar11 + 1;
          } while (_w_00 != uVar11);
        }
        uVar10 = uVar10 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
      } while (uVar10 != uVar13);
    }
    iVar8 = 0;
  }
  else {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,_w,sVar2,opt->workspace_allocator);
    iVar8 = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      uVar10 = (ulong)_w_00;
      if ((int)_w < 1) {
LAB_0044525c:
        fVar14 = 0.0;
      }
      else {
        pvVar6 = bottom_top_blob->data;
        sVar2 = bottom_top_blob->cstep;
        sVar3 = bottom_top_blob->elemsize;
        uVar11 = 0;
        do {
          fVar14 = 0.0;
          if (0 < (int)_w_00) {
            uVar9 = 0;
            do {
              fVar15 = *(float *)((long)pvVar6 + uVar9 * 4);
              fVar14 = fVar14 + fVar15 * fVar15;
              uVar9 = uVar9 + 1;
            } while (uVar10 != uVar9);
          }
          *(float *)((long)local_78.data + uVar11 * 4) = fVar14;
          uVar11 = uVar11 + 1;
          pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
        } while (uVar11 != uVar13);
        if ((int)_w < 1) goto LAB_0044525c;
        fVar14 = 0.0;
        uVar11 = 0;
        do {
          fVar14 = fVar14 + *(float *)((long)local_78.data + uVar11 * 4);
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      if (this->eps_mode == 0) {
        fVar14 = fVar14 + this->eps;
LAB_00445295:
        fVar15 = SQRT(fVar14);
      }
      else {
        if (this->eps_mode != 1) {
          if (fVar14 <= this->eps) {
            fVar14 = this->eps;
          }
          goto LAB_00445295;
        }
        fVar15 = SQRT(fVar14);
        if (SQRT(fVar14) <= this->eps) {
          fVar15 = this->eps;
        }
      }
      if (this->channel_shared == 0) {
        if (0 < (int)_w) {
          pvVar6 = bottom_top_blob->data;
          sVar2 = bottom_top_blob->cstep;
          sVar3 = bottom_top_blob->elemsize;
          pvVar4 = (this->scale_data).data;
          uVar11 = 0;
          do {
            if (0 < (int)_w_00) {
              fVar14 = *(float *)((long)pvVar4 + uVar11 * 4);
              uVar9 = 0;
              do {
                *(float *)((long)pvVar6 + uVar9 * 4) =
                     *(float *)((long)pvVar6 + uVar9 * 4) * fVar14 * (1.0 / fVar15);
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            uVar11 = uVar11 + 1;
            pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
          } while (uVar11 != uVar13);
        }
      }
      else if (0 < (int)_w) {
        fVar14 = *(this->scale_data).data;
        pvVar6 = bottom_top_blob->data;
        sVar2 = bottom_top_blob->cstep;
        sVar3 = bottom_top_blob->elemsize;
        uVar11 = 0;
        do {
          if (0 < (int)_w_00) {
            uVar9 = 0;
            do {
              *(float *)((long)pvVar6 + uVar9 * 4) =
                   *(float *)((long)pvVar6 + uVar9 * 4) * (1.0 / fVar15) * fVar14;
              uVar9 = uVar9 + 1;
            } while (uVar10 != uVar9);
          }
          uVar11 = uVar11 + 1;
          pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
        } while (uVar11 != uVar13);
      }
      iVar8 = 0;
    }
    piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar8;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar8;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return iVar8;
    }
LAB_0044549e:
    if (local_78.data != (void *)0x0) {
      free(local_78.data);
    }
  }
  return iVar8;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q = 0; q < channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = static_cast<float>(1.f / sqrt(ssum + eps));
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max((float)sqrt(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = static_cast<float>(1.f / sqrt(ssum + eps));
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max((float)sqrt(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}